

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O3

void __thiscall
soplex::SPxLPBase<double>::doAddCol(SPxLPBase<double> *this,LPColBase<double> *col,bool scale)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  pointer pdVar5;
  Nonzero<double> *pNVar6;
  bool bVar7;
  double *pdVar8;
  double dVar9;
  Item *pIVar10;
  int iVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  int idx;
  double val;
  int local_ac;
  int local_94;
  _func_int **local_90;
  double local_88;
  undefined8 uStack_80;
  double local_78;
  DataKey local_70;
  LPRowBase<double> local_68;
  
  iVar3 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
  iVar4 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
  local_68.left = -NAN;
  local_94 = iVar3;
  LPColSetBase<double>::add(&this->super_LPColSetBase<double>,(DataKey *)&local_68,col);
  if (this->thesense != MAXIMIZE) {
    pdVar5 = (this->super_LPColSetBase<double>).object.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    pdVar5[iVar3] = -pdVar5[iVar3];
  }
  pIVar10 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem +
            (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey[iVar3].idx;
  local_ac = 0;
  if (scale) {
    local_ac = (*this->lp_scaler->_vptr_SPxScaler[1])
                         (this->lp_scaler,pIVar10,&(this->super_LPRowSetBase<double>).scaleExp);
    dVar9 = (this->super_LPColSetBase<double>).up.val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[iVar3];
    ::soplex::infinity::__tls_init();
    pdVar8 = (double *)__tls_get_addr(&PTR_003b4b70);
    local_88 = *pdVar8;
    uStack_80 = 0;
    if (dVar9 < local_88) {
      dVar9 = ldexp((this->super_LPColSetBase<double>).up.val.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar3],-local_ac);
      (this->super_LPColSetBase<double>).up.val.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_start[iVar3] = dVar9;
    }
    dVar9 = (this->super_LPColSetBase<double>).low.val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[iVar3];
    ::soplex::infinity::__tls_init();
    if (-local_88 < dVar9) {
      dVar9 = ldexp((this->super_LPColSetBase<double>).low.val.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar3],-local_ac);
      (this->super_LPColSetBase<double>).low.val.super__Vector_base<double,_std::allocator<double>_>
      ._M_impl.super__Vector_impl_data._M_start[iVar3] = dVar9;
    }
    dVar9 = ldexp((this->super_LPColSetBase<double>).object.val.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar3],local_ac);
    (this->super_LPColSetBase<double>).object.val.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
    [iVar3] = dVar9;
    (this->super_LPColSetBase<double>).scaleExp.data[iVar3] = local_ac;
  }
  dVar9 = (double)(long)(pIVar10->data).super_SVectorBase<double>.memused;
  if (0 < (long)dVar9) {
    local_90 = (_func_int **)&PTR__DSVectorBase_003ae9c8;
    do {
      dVar1 = (double)((long)dVar9 + -1);
      pNVar6 = (pIVar10->data).super_SVectorBase<double>.m_elem;
      iVar3 = pNVar6[(long)dVar1].idx;
      dVar2 = pNVar6[(long)dVar1].val;
      uVar12 = SUB84(dVar2,0);
      uVar13 = (undefined4)((ulong)dVar2 >> 0x20);
      local_88 = dVar1;
      if (scale) {
        dVar2 = ldexp(dVar2,(this->super_LPRowSetBase<double>).scaleExp.data[iVar3] + local_ac);
        uVar12 = SUB84(dVar2,0);
        uVar13 = (undefined4)((ulong)dVar2 >> 0x20);
        (pIVar10->data).super_SVectorBase<double>.m_elem[(long)dVar1].val = dVar2;
      }
      local_78 = (double)CONCAT44(uVar13,uVar12);
      if ((this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum <= iVar3) {
        LPRowBase<double>::LPRowBase(&local_68,0);
        iVar11 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
        if (iVar11 <= iVar3) {
          iVar11 = (iVar3 - iVar11) + 1;
          do {
            local_70.info = 0;
            local_70.idx = -1;
            LPRowSetBase<double>::add(&this->super_LPRowSetBase<double>,&local_70,&local_68);
            iVar11 = iVar11 + -1;
          } while (iVar11 != 0);
        }
        local_68.vec._vptr_DSVectorBase = local_90;
        if (local_68.vec.theelem != (Nonzero<double> *)0x0) {
          free(local_68.vec.theelem);
        }
      }
      SVSetBase<double>::add2
                ((SVSetBase<double> *)this,
                 (SVectorBase<double> *)
                 ((this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem +
                 (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey[iVar3].idx),1
                 ,&local_94,&local_78);
      bVar7 = 1 < (long)dVar9;
      dVar9 = local_88;
    } while (bVar7);
  }
  (*(this->super_LPRowSetBase<double>).super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x51])(this,1);
  (*(this->super_LPRowSetBase<double>).super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x50])
            (this,(ulong)(uint)((this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.
                                thenum - iVar4));
  return;
}

Assistant:

void doAddCol(const LPColBase<R>& col, bool scale = false)
   {
      int idx = nCols();
      int oldRowNumber = nRows();
      int newColScaleExp = 0;

      LPColSetBase<R>::add(col);

      if(thesense != MAXIMIZE)
         LPColSetBase<R>::maxObj_w(idx) *= -1;

      SVectorBase<R>& vec = colVector_w(idx);

      DataArray <int>& rowscaleExp = LPRowSetBase<R>::scaleExp;

      // compute new column scaling factor and apply it to the bounds
      if(scale)
      {
         newColScaleExp = lp_scaler->computeScaleExp(vec, rowscaleExp);

         if(upper(idx) < R(infinity))
            upper_w(idx) = spxLdexp(upper_w(idx), - newColScaleExp);

         if(lower(idx) > R(-infinity))
            lower_w(idx) = spxLdexp(lower_w(idx), - newColScaleExp);

         maxObj_w(idx) = spxLdexp(maxObj_w(idx), newColScaleExp);

         LPColSetBase<R>::scaleExp[idx] = newColScaleExp;
      }

      // now insert nonzeros to row file also
      for(int j = vec.size() - 1; j >= 0; --j)
      {
         int i = vec.index(j);

         // apply new column and existing row scaling factors to new values in ColSet
         if(scale)
            vec.value(j) = spxLdexp(vec.value(j), newColScaleExp + rowscaleExp[i]);

         R val = vec.value(j);

         // create new rows if required
         if(i >= nRows())
         {
            LPRowBase<R> empty;

            for(int k = nRows(); k <= i; ++k)
               LPRowSetBase<R>::add(empty);
         }

         assert(i < nRows());
         LPRowSetBase<R>::add2(i, 1, &idx, &val);
      }

      addedCols(1);
      addedRows(nRows() - oldRowNumber);
   }